

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O2

char * printContainer(SResource *res,char *container,char *restype,char *mimetype,char *id,
                     UErrorCode *status)

{
  size_t s;
  uint uVar1;
  FileStream *pFVar2;
  UErrorCode *status_00;
  SResource *pSVar3;
  int32_t iVar4;
  int32_t srcLen;
  char *value;
  UChar *buffer;
  UChar *buffer_00;
  int32_t extraout_EDX;
  int32_t extraout_EDX_00;
  int32_t extraout_EDX_01;
  int32_t extraout_EDX_02;
  char *result;
  char *curKey;
  int32_t bufLen;
  UChar *trans;
  UChar *desc;
  char *buf;
  int32_t local_2a4;
  UErrorCode *local_2a0;
  char *local_298;
  UChar *local_290;
  UChar *local_288;
  SResource *local_280;
  char *local_278;
  UnicodeString local_270;
  UnicodeString local_230;
  UnicodeString local_1f0;
  UnicodeString local_1b0;
  UnicodeString local_170;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_2a0 = status;
  write_tabs(out);
  local_280 = res;
  value = SResource::getKeyString(res,srBundle);
  if ((value == (char *)0x0) || (curKey = value, *value == '\0')) {
    curKey = (char *)0x0;
  }
  local_298 = getID(id,curKey,result);
  pFVar2 = out;
  icu_63::UnicodeString::UnicodeString(&local_1b0,"<");
  write_utf8_file(pFVar2,&local_1b0);
  icu_63::UnicodeString::~UnicodeString(&local_1b0);
  pFVar2 = out;
  icu_63::UnicodeString::UnicodeString(&local_1f0,container);
  write_utf8_file(pFVar2,&local_1f0);
  icu_63::UnicodeString::~UnicodeString(&local_1f0);
  printAttribute("id",local_298,extraout_EDX);
  iVar4 = extraout_EDX_00;
  if (value != (char *)0x0) {
    printAttribute("resname",value,extraout_EDX_00);
    iVar4 = extraout_EDX_01;
  }
  if (mimetype != (char *)0x0) {
    printAttribute("mime-type",mimetype,iVar4);
    iVar4 = extraout_EDX_02;
  }
  if (restype != (char *)0x0) {
    printAttribute("restype",restype,iVar4);
  }
  pFVar2 = out;
  tabCount = tabCount + 1;
  uVar1 = (local_280->fComment).fLength;
  if ((int)uVar1 < 1) {
    icu_63::UnicodeString::UnicodeString(&local_230,">\n");
    write_utf8_file(pFVar2,&local_230);
    icu_63::UnicodeString::~UnicodeString(&local_230);
    return local_298;
  }
  if (local_2a0 == (UErrorCode *)0x0) {
    return local_298;
  }
  if (U_ZERO_ERROR < *local_2a0) {
    return local_298;
  }
  local_278 = (char *)0x0;
  local_2a4 = 0;
  s = (ulong)uVar1 * 2 + 2;
  buffer = (UChar *)uprv_malloc_63(s);
  local_288 = buffer;
  buffer_00 = (UChar *)uprv_malloc_63(s);
  pSVar3 = local_280;
  status_00 = local_2a0;
  local_290 = buffer_00;
  if (buffer_00 == (UChar *)0x0 || buffer == (UChar *)0x0) {
    *local_2a0 = U_MEMORY_ALLOCATION_ERROR;
    uprv_free_63(buffer);
    goto LAB_0022117c;
  }
  iVar4 = removeCmtText((local_280->fComment).fChars,(local_280->fComment).fLength,local_2a0);
  (pSVar3->fComment).fLength = iVar4;
  iVar4 = getDescription((pSVar3->fComment).fChars,iVar4,&local_288,uVar1 + 1,status_00);
  srcLen = getTranslate((pSVar3->fComment).fChars,(pSVar3->fComment).fLength,&local_290,uVar1 + 1,
                        status_00);
  pFVar2 = out;
  if (srcLen < 1) {
    icu_63::UnicodeString::UnicodeString(&local_270,">\n");
    write_utf8_file(pFVar2,&local_270);
LAB_00221136:
    icu_63::UnicodeString::~UnicodeString(&local_270);
  }
  else {
    local_278 = convertAndEscape(&local_278,0,&local_2a4,local_290,srcLen,status_00);
    if (*status_00 < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::UnicodeString(&local_170,local_278,local_2a4,"UTF-8");
      pFVar2 = out;
      icu_63::UnicodeString::UnicodeString(&local_270," ");
      write_utf8_file(pFVar2,&local_270);
      icu_63::UnicodeString::~UnicodeString(&local_270);
      pFVar2 = out;
      icu_63::UnicodeString::UnicodeString(&local_70,"translate");
      write_utf8_file(pFVar2,&local_70);
      icu_63::UnicodeString::~UnicodeString(&local_70);
      pFVar2 = out;
      icu_63::UnicodeString::UnicodeString(&local_b0," = \"");
      write_utf8_file(pFVar2,&local_b0);
      icu_63::UnicodeString::~UnicodeString(&local_b0);
      pFVar2 = out;
      icu_63::UnicodeString::UnicodeString(&local_f0,&local_170);
      write_utf8_file(pFVar2,&local_f0);
      icu_63::UnicodeString::~UnicodeString(&local_f0);
      pFVar2 = out;
      icu_63::UnicodeString::UnicodeString(&local_130,"\"");
      write_utf8_file(pFVar2,&local_130);
      icu_63::UnicodeString::~UnicodeString(&local_130);
      icu_63::UnicodeString::~UnicodeString(&local_170);
      pFVar2 = out;
      icu_63::UnicodeString::UnicodeString(&local_270,">\n");
      write_utf8_file(pFVar2,&local_270);
      goto LAB_00221136;
    }
  }
  if (0 < iVar4) {
    write_tabs(out);
    print(local_288,iVar4,"<!--","-->",local_2a0);
  }
  uprv_free_63(local_288);
  buffer_00 = local_290;
LAB_0022117c:
  uprv_free_63(buffer_00);
  return local_298;
}

Assistant:

static char *printContainer(SResource *res, const char *container, const char *restype, const char *mimetype, const char *id, UErrorCode *status)
{
    const char *resname = NULL;
    char *sid = NULL;

    write_tabs(out);

    resname = res->getKeyString(srBundle);
    if (resname != NULL && *resname != 0) {
        sid = getID(id, resname, sid);
    } else {
        sid = getID(id, NULL, sid);
    }

    write_utf8_file(out, UnicodeString("<"));
    write_utf8_file(out, UnicodeString(container));
    printAttribute("id", sid, (int32_t) uprv_strlen(sid));

    if (resname != NULL) {
        printAttribute("resname", resname, (int32_t) uprv_strlen(resname));
    }

    if (mimetype != NULL) {
        printAttribute("mime-type", mimetype, (int32_t) uprv_strlen(mimetype));
    }

    if (restype != NULL) {
        printAttribute("restype", restype, (int32_t) uprv_strlen(restype));
    }

    tabCount += 1;
    if (res->fComment.fLength > 0) {
        /* printComments will print the closing ">\n" */
        printComments(&res->fComment, resname, TRUE, status);
    } else {
        write_utf8_file(out, UnicodeString(">\n"));
    }

    return sid;
}